

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.hpp
# Opt level: O3

void array_delete<Lib::DArray<std::__cxx11::string>>
               (DArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *array,size_t length)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **ppbVar3;
  
  if (length != 0) {
    ppbVar3 = &array[length - 1]._array;
    do {
      if (*ppbVar3 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        array_delete<std::__cxx11::string>(*ppbVar3,(size_t)ppbVar3[-1]);
        pbVar1 = *ppbVar3;
        if (pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          uVar2 = (long)ppbVar3[-1] << 5;
          if (uVar2 == 0) {
            (pbVar1->_M_dataplus)._M_p = (pointer)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
            Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pbVar1;
          }
          else if (uVar2 < 0x21) {
            (pbVar1->_M_dataplus)._M_p = (pointer)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
            Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pbVar1;
          }
          else if (uVar2 < 0x31) {
            (pbVar1->_M_dataplus)._M_p = (pointer)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
            Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pbVar1;
          }
          else if (uVar2 < 0x41) {
            (pbVar1->_M_dataplus)._M_p = (pointer)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
            Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pbVar1;
          }
          else {
            operator_delete(pbVar1,0x10);
          }
        }
      }
      length = length - 1;
      ppbVar3 = ppbVar3 + -3;
    } while (length != 0);
  }
  return;
}

Assistant:

void array_delete(T* array, size_t length)
{
  ASS_NEQ(array,0);
  ASS_G(length,0);

  array+=length;
  while(length--) {
    (--array)->~T();
  }
}